

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader.c
# Opt level: O0

void emit_D3D_opcode_dsss(Context *ctx,char *opcode)

{
  long lVar1;
  size_t sVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long alStack_140 [2];
  long lStack_130;
  char acStack_128 [8];
  size_t local_120;
  char local_118 [8];
  char src2 [64];
  char src1 [64];
  char src0 [64];
  char dst [64];
  char *opcode_local;
  Context *ctx_local;
  
  local_120 = 0x40;
  lStack_130 = 0x1234ec;
  make_D3D_destarg_string(ctx,src0 + 0x38,0x40);
  lStack_130 = 0x123507;
  make_D3D_srcarg_string(ctx,0,src1 + 0x38,local_120);
  lStack_130 = 0x123523;
  make_D3D_srcarg_string(ctx,1,src2 + 0x38,local_120);
  lStack_130 = 0x12353f;
  make_D3D_srcarg_string(ctx,2,local_118,local_120);
  lStack_130 = 0x123548;
  sVar2 = strlen(opcode);
  lVar1 = -(sVar2 + 0x10 & 0xfffffffffffffff0);
  pcVar5 = acStack_128 + lVar1 + -8;
  builtin_strncpy(acStack_128 + lVar1 + -8,"b5\x12",4);
  pcVar5[4] = '\0';
  pcVar5[5] = '\0';
  pcVar5[6] = '\0';
  pcVar5[7] = '\0';
  pcVar3 = lowercase(acStack_128 + lVar1,opcode);
  pcVar4 = "";
  if (ctx->coissue != 0) {
    pcVar4 = "+";
  }
  *(char **)((long)alStack_140 + lVar1 + 8) = src2 + 0x38;
  *(char **)(acStack_128 + lVar1 + -8) = local_118;
  *(undefined8 *)((long)alStack_140 + lVar1) = 0x1235c1;
  output_line(ctx,"%s%s%s, %s, %s, %s",pcVar4,pcVar3,src0 + 0x38,src1 + 0x38);
  return;
}

Assistant:

static void emit_D3D_opcode_dsss(Context *ctx, const char *opcode)
{
    char dst[64]; make_D3D_destarg_string(ctx, dst, sizeof (dst));
    char src0[64]; make_D3D_srcarg_string(ctx, 0, src0, sizeof (src0));
    char src1[64]; make_D3D_srcarg_string(ctx, 1, src1, sizeof (src1));
    char src2[64]; make_D3D_srcarg_string(ctx, 2, src2, sizeof (src2));
    opcode = lowercase((char *) alloca(strlen(opcode) + 1), opcode);
    output_line(ctx, "%s%s%s, %s, %s, %s", ctx->coissue ? "+" : "", 
                opcode, dst, src0, src1, src2);
}